

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_get_declared_struct_size(spvc_compiler compiler,spvc_type struct_type,size_t *size)

{
  size_t sVar1;
  
  sVar1 = spirv_cross::Compiler::get_declared_struct_size
                    ((compiler->compiler)._M_t.
                     super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                     .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,
                     (SPIRType *)struct_type);
  *size = sVar1;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_struct_size(spvc_compiler compiler, spvc_type struct_type, size_t *size)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		*size = compiler->compiler->get_declared_struct_size(*static_cast<const SPIRType *>(struct_type));
	}